

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

AGLFramebuffer aGLFramebufferCreate(AGLFramebufferCreate params)

{
  GLenum error;
  int iVar1;
  char *message;
  AGLFramebuffer fbo;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  AGLFramebuffer local_18;
  
  local_18.name = 0;
  local_18.depth_renderbuffer = 0;
  glGenFramebuffers(1);
  error = glGetError();
  if (error == 0) {
    glBindFramebuffer(0x8d40,(ulong)local_18 & 0xffffffff);
    error = glGetError();
    if (error == 0) {
      if (in_stack_00000008 == 0) {
        aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                        ,0x55f,"params.color");
        aAppTerminate(-1);
      }
      else {
        glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,*(undefined4 *)(in_stack_00000008 + 0x24),0);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1378: glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, params.color->_.name, 0) returned "
          ;
          goto LAB_001052e9;
        }
      }
      if (in_stack_00000010 == 0) {
        glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,0);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1398: glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0) returned "
          ;
          goto LAB_001052e9;
        }
      }
      else if (in_stack_00000018 == 0) {
        glGenRenderbuffers(1,&local_18.depth_renderbuffer);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1389: glGenRenderbuffers(1, &fbo.depth_renderbuffer) returned "
          ;
          goto LAB_001052e9;
        }
        glBindRenderbuffer(0x8d41,local_18.depth_renderbuffer);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1390: glBindRenderbuffer(GL_RENDERBUFFER, fbo.depth_renderbuffer) returned "
          ;
          goto LAB_001052e9;
        }
        glRenderbufferStorage
                  (0x8d41,0x1902,*(undefined4 *)(in_stack_00000008 + 8),
                   *(undefined4 *)(in_stack_00000008 + 0xc));
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1391: glRenderbufferStorage(GL_RENDERBUFFER, depth_component, params.color->width, params.color->height) returned "
          ;
          goto LAB_001052e9;
        }
        glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,local_18.depth_renderbuffer);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1393: glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, fbo.depth_renderbuffer) returned "
          ;
          goto LAB_001052e9;
        }
        glBindRenderbuffer(0x8d41,0);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1394: glBindRenderbuffer(GL_RENDERBUFFER, 0) returned "
          ;
          goto LAB_001052e9;
        }
      }
      else {
        glFramebufferTexture2D(0x8d40,0x8d00,0xde1,*(undefined4 *)(in_stack_00000018 + 0x24),0);
        error = glGetError();
        if (error != 0) {
          message = 
          "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1382: glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, params.depth.texture->_.name, 0) returned "
          ;
          goto LAB_001052e9;
        }
      }
      iVar1 = glCheckFramebufferStatus(0x8d40);
      if (iVar1 != 0x8cd5) {
        aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                        "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                        ,0x57a,"status == GL_FRAMEBUFFER_COMPLETE");
        aAppTerminate(-1);
      }
      glBindFramebuffer(0x8d40,a__gl_state.framebuffer.binding);
      error = glGetError();
      if (error == 0) {
        return local_18;
      }
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1404: glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding) returned "
      ;
    }
    else {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1373: glBindFramebuffer(GL_FRAMEBUFFER, fbo.name) returned "
      ;
    }
  }
  else {
    message = 
    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1372: glGenFramebuffers(1, &fbo.name) returned "
    ;
  }
LAB_001052e9:
  a__GlPrintError(message,error);
  abort();
}

Assistant:

AGLFramebuffer aGLFramebufferCreate(AGLFramebufferCreate params) {
	AGLFramebuffer fbo = {0};
	AGL__CALL(glGenFramebuffers(1, &fbo.name));
	AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, fbo.name));

	ATTO_ASSERT(params.color);

	if (params.color)
		AGL__CALL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, params.color->_.name, 0));

	if (params.depth.enable) {
		if (params.depth.texture) {
			AGL__CALL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, params.depth.texture->_.name, 0));
		} else {
#ifdef ATTO_GLES
			const GLenum depth_component = GL_DEPTH_COMPONENT16;
#else
			const GLenum depth_component = GL_DEPTH_COMPONENT;
#endif
			AGL__CALL(glGenRenderbuffers(1, &fbo.depth_renderbuffer));
			AGL__CALL(glBindRenderbuffer(GL_RENDERBUFFER, fbo.depth_renderbuffer));
			AGL__CALL(glRenderbufferStorage(GL_RENDERBUFFER, depth_component, params.color->width, params.color->height));
			AGL__CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER,
				GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, fbo.depth_renderbuffer));
			AGL__CALL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
		}
	} else {
		// Depth disabled
		AGL__CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0));
	}

	const GLenum status = glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ATTO_ASSERT(status == GL_FRAMEBUFFER_COMPLETE);

	AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding));
	return fbo;
}